

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionloader.cpp
# Opt level: O3

void __thiscall
stackjit::FunctionLoader::generateDefinition
          (FunctionLoader *this,Function *function,FunctionDefinition *definition)

{
  VMState *pVVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer ppTVar4;
  FunctionDefinition *pFVar5;
  Function *this_00;
  bool bVar6;
  AccessModifier accessModifier;
  bool bVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  long *plVar10;
  Type *pTVar11;
  ClassType *classType;
  AttributeContainer *pAVar12;
  runtime_error *this_01;
  size_type *psVar13;
  pointer pbVar14;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> parameters;
  undefined1 local_1b8 [32];
  FunctionDefinition *local_198;
  Type *local_190;
  Function *local_188;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param;
  pointer local_140;
  pointer ppTStack_138;
  pointer local_130;
  pointer local_128;
  pointer ppTStack_120;
  pointer local_118;
  Type *local_110;
  BytePtr puStack_108;
  bool local_100;
  bool bStack_ff;
  undefined6 uStack_fe;
  ClassType *pCStack_f8;
  _Alloc_hider local_f0;
  char local_e0 [18];
  bool local_ce;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pVVar1 = this->mVMState;
  local_198 = definition;
  Loader::Function::returnType_abi_cxx11_(&local_50,function);
  local_190 = LoaderHelpers::getType(pVVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188 = function;
  pvVar9 = Loader::Function::parameters_abi_cxx11_(function);
  pbVar14 = (pvVar9->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar9->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 != pbVar2) {
    do {
      pcVar3 = (pbVar14->_M_dataplus)._M_p;
      param._M_dataplus._M_p = (pointer)&param.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&param,pcVar3,pcVar3 + pbVar14->_M_string_length);
      pVVar1 = this->mVMState;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,param._M_dataplus._M_p,
                 param._M_dataplus._M_p + param._M_string_length);
      local_1b8._0_8_ = LoaderHelpers::getType(pVVar1,&local_90);
      if (parameters.
          super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          parameters.
          super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>>::
        _M_realloc_insert<stackjit::Type_const*>
                  ((vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>> *)
                   &parameters,
                   (iterator)
                   parameters.
                   super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(Type **)local_1b8);
      }
      else {
        *parameters.
         super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl
         .super__Vector_impl_data._M_finish = (Type *)local_1b8._0_8_;
        parameters.
        super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             parameters.
             super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)param._M_dataplus._M_p != &param.field_2) {
        operator_delete(param._M_dataplus._M_p);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar2);
  }
  this_00 = local_188;
  bVar6 = Loader::Function::isMemberFunction(local_188);
  if (bVar6) {
    pVVar1 = this->mVMState;
    Loader::Function::className_abi_cxx11_(&param,this_00);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&param,0,(char *)0x0,0x176550);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_180.field_2._M_allocated_capacity = *psVar13;
      local_180.field_2._8_8_ = plVar10[3];
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar13;
      local_180._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_180._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pTVar11 = LoaderHelpers::getType(pVVar1,&local_180);
    if (pTVar11 == (Type *)0x0) {
      classType = (ClassType *)0x0;
    }
    else {
      classType = (ClassType *)__dynamic_cast(pTVar11,&Type::typeinfo,&ClassType::typeinfo,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)param._M_dataplus._M_p != &param.field_2) {
      operator_delete(param._M_dataplus._M_p);
    }
    if (classType == (ClassType *)0x0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      Loader::Function::className_abi_cxx11_(&local_70,this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "\'",&local_70);
      plVar10 = (long *)std::__cxx11::string::append(local_1b8);
      param._M_dataplus._M_p = (pointer)*plVar10;
      psVar13 = (size_type *)(plVar10 + 2);
      if ((size_type *)param._M_dataplus._M_p == psVar13) {
        param.field_2._M_allocated_capacity = *psVar13;
        param.field_2._8_8_ = plVar10[3];
        param._M_dataplus._M_p = (pointer)&param.field_2;
      }
      else {
        param.field_2._M_allocated_capacity = *psVar13;
      }
      param._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(this_01,(string *)&param);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar12 = Loader::Function::attributes_abi_cxx11_(this_00);
    accessModifier = LoaderHelpers::getAccessModifier(pAVar12);
    pAVar12 = Loader::Function::attributes_abi_cxx11_(this_00);
    bVar6 = LoaderHelpers::getIsVirtual(pAVar12);
  }
  else {
    accessModifier = Public;
    classType = (ClassType *)0x0;
    bVar6 = false;
  }
  bVar7 = Loader::Function::isMemberFunction(this_00);
  if (bVar7) {
    Loader::Function::memberFunctionName_abi_cxx11_(&local_b0,this_00);
  }
  else {
    Loader::Function::name_abi_cxx11_(&local_b0,this_00);
  }
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (&local_c8,&parameters);
  Loader::Function::memberFunctionName_abi_cxx11_((string *)local_1b8,this_00);
  iVar8 = std::__cxx11::string::compare(local_1b8);
  FunctionDefinition::FunctionDefinition
            ((FunctionDefinition *)&param,&local_b0,&local_c8,local_190,classType,accessModifier,
             iVar8 == 0,bVar6);
  pFVar5 = local_198;
  std::__cxx11::string::operator=((string *)local_198,(string *)&param);
  ppTVar4 = (pFVar5->mParameters).
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (pFVar5->mParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = local_140;
  (pFVar5->mParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppTStack_138;
  (pFVar5->mParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_130;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4);
  }
  ppTVar4 = (pFVar5->mCallParameters).
            super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (pFVar5->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = local_128;
  (pFVar5->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppTStack_120;
  (pFVar5->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_118;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4);
  }
  pFVar5->mIsManaged = local_100;
  pFVar5->mIsMemberFunction = bStack_ff;
  *(undefined6 *)&pFVar5->field_0x62 = uStack_fe;
  pFVar5->mClassType = pCStack_f8;
  pFVar5->mReturnType = local_110;
  pFVar5->mEntryPoint = puStack_108;
  std::__cxx11::string::operator=((string *)&pFVar5->mMemberName,(string *)&local_f0);
  pFVar5->mIsVirtual = local_ce;
  pFVar5->mAccessModifier = local_e0[0x10];
  pFVar5->mIsConstructor = (bool)local_e0[0x11];
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)param._M_dataplus._M_p != &param.field_2) {
    operator_delete(param._M_dataplus._M_p);
  }
  if ((Type *)local_1b8._0_8_ != (Type *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_);
  }
  if (local_c8.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (parameters.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(parameters.
                    super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FunctionLoader::generateDefinition(const Loader::Function& function, FunctionDefinition& definition) {
		auto returnType = LoaderHelpers::getType(mVMState, function.returnType());

		std::vector<const Type*> parameters;
		for (auto param : function.parameters()) {
			parameters.push_back(LoaderHelpers::getType(mVMState, param));
		}

		const ClassType* classType = nullptr;
		AccessModifier accessModifier = DEFAULT_ACCESS_MODIFIER;
		bool isVirtual = false;

		if (function.isMemberFunction()) {
			classType = dynamic_cast<const ClassType*>(LoaderHelpers::getType(mVMState, "Ref." + function.className()));
			if (classType == nullptr) {
				throw std::runtime_error("'" + function.className() + "' is not a class type.");
			}

			accessModifier = LoaderHelpers::getAccessModifier(function.attributes());
			isVirtual = LoaderHelpers::getIsVirtual(function.attributes());
		}

		definition = FunctionDefinition(
			function.isMemberFunction() ? function.memberFunctionName() : function.name(),
			parameters,
			returnType,
			classType,
			accessModifier,
			function.memberFunctionName() == ".constructor",
			isVirtual);
	}